

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

bool __thiscall
kj::ArrayPtr<const_char>::startsWith(ArrayPtr<const_char> *this,ArrayPtr<const_char> *other)

{
  bool bVar1;
  ArrayPtr<const_char> local_10;
  
  local_10.size_ = other->size_;
  if (this->size_ < local_10.size_) {
    return false;
  }
  local_10.ptr = this->ptr;
  bVar1 = operator==(&local_10,other);
  return bVar1;
}

Assistant:

inline constexpr size_t size() const { return size_; }